

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O2

Dims * adios2::helper::StringToDims(Dims *__return_storage_ptr__,string *dimensions)

{
  size_t end;
  ulong uVar1;
  ulong uVar2;
  unsigned_long_long local_58;
  string s;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = 0;
  for (uVar2 = 0; uVar2 < dimensions->_M_string_length; uVar2 = uVar2 + 1) {
    if ((dimensions->_M_dataplus)._M_p[uVar2] == ',') {
      std::__cxx11::string::string((string *)&s,(string *)dimensions,uVar1,uVar2 - uVar1);
      local_58 = std::__cxx11::stoull(&s,(size_t *)0x0,10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (__return_storage_ptr__,&local_58);
      uVar1 = uVar2 + 1;
      std::__cxx11::string::~string((string *)&s);
      uVar2 = uVar1;
    }
  }
  std::__cxx11::string::string
            ((string *)&s,(string *)dimensions,uVar1,dimensions->_M_string_length - uVar1);
  local_58 = std::__cxx11::stoull(&s,(size_t *)0x0,10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (__return_storage_ptr__,&local_58);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

Dims StringToDims(const std::string &dimensions)
{
    std::vector<size_t> shape;
    size_t begin = 0;
    for (size_t end = 0; end < dimensions.size(); ++end)
    {
        if (dimensions[end] == ',')
        {
            std::string s(dimensions, begin, end - begin);
            shape.push_back(stoull(s));
            begin = end + 1;
            end = begin;
        }
    }
    std::string s(dimensions, begin, dimensions.size() - begin);
    shape.push_back(stoull(s));
    return shape;
}